

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Point3fi * __thiscall pbrt::Point3fi::operator-(Point3fi *this,Vector3<pbrt::Interval<float>_> *v)

{
  FloatInterval y;
  long in_RDX;
  Point3fi *in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Interval<float> *in_stack_ffffffffffffffc0;
  FloatInterval z;
  Interval<float> in_stack_ffffffffffffffc8;
  FloatInterval x;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar1._0_8_ = Interval<float>::operator-<float>
                           (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  auVar1._8_56_ = extraout_var;
  vmovlpd_avx(auVar1._0_16_);
  x = *(FloatInterval *)(in_RDX + 8);
  auVar2._0_8_ = Interval<float>::operator-<float>
                           (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  auVar2._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar2._0_16_);
  z = *(FloatInterval *)(in_RDX + 0x10);
  auVar3._0_8_ = Interval<float>::operator-<float>((Interval<float> *)z,in_stack_ffffffffffffffc8);
  auVar3._8_56_ = extraout_var_01;
  y = (FloatInterval)vmovlpd_avx(auVar3._0_16_);
  Point3fi(in_RDI,x,y,z);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU Point3fi operator-(const Vector3<U> &v) const {
        DCHECK(!v.HasNaN());
        return {x - v.x, y - v.y, z - v.z};
    }